

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

bool __thiscall StatisticsApp::display(StatisticsApp *this)

{
  ostream *poVar1;
  StatisticsWriter writer;
  allocator<char> local_71;
  string local_70;
  StatisticsWriter local_50;
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"#",(allocator<char> *)&local_70);
  std::__cxx11::string::string((string *)&local_50,local_30);
  std::__cxx11::string::~string(local_30);
  if ((this->_options).showStatistics == true) {
    StatisticsWriter::writeStatistics(&local_50,this->_outputStream,&this->_tracker);
  }
  if ((this->_options).showCovariance == true) {
    poVar1 = this->_outputStream;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Covariance",&local_71);
    StatisticsWriter::writeMatrix<double>(&local_50,poVar1,&this->_tracker,&local_70,0x186fc4);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->_options).showCorrelation == true) {
    poVar1 = this->_outputStream;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Correlation",&local_71);
    StatisticsWriter::writeMatrix<double>(&local_50,poVar1,&this->_tracker,&local_70,0x187052);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->_options).showLeastSquaresOffset == true) {
    poVar1 = this->_outputStream;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Offset",&local_71);
    StatisticsWriter::writeMatrix<double>(&local_50,poVar1,&this->_tracker,&local_70,0x1870f8);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->_options).showLeastSquaresSlope == true) {
    poVar1 = this->_outputStream;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"Slope",&local_71);
    StatisticsWriter::writeMatrix<double>(&local_50,poVar1,&this->_tracker,&local_70,0x18714a);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->_options).showHistogram == true) {
    StatisticsWriter::writeHistograms(&local_50,this->_outputStream,&this->_tracker);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool
    display()
    {

        // ==================================================
        // Write output to stream
        // --------------------------------------------------
        StatisticsWriter writer;
        
        // Show statistics
        if (this->_options.showStatistics)
        {
            writer.writeStatistics(*this->_outputStream, this->_tracker);
        }
        
        // Show covariance
        if (this->_options.showCovariance)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Covariance", &MultivariateTracker::getCovariance);
        }

        // Show correlation
        if (this->_options.showCorrelation)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Correlation", &MultivariateTracker::getCorrelation);
        }

        // Show least squares fit offset
        if (this->_options.showLeastSquaresOffset)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Offset", &MultivariateTracker::getLeastSquaresOffset);
        }

        // Show least squares fit slope
        if (this->_options.showLeastSquaresSlope)
        {
            writer.writeMatrix<double>(*this->_outputStream, this->_tracker, "Slope", &MultivariateTracker::getLeastSquaresSlope);
        }
        
        // Show histogram
        if (this->_options.showHistogram)
        {
            writer.writeHistograms(*this->_outputStream, this->_tracker);
        }

        return true;

    }